

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O2

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlyFinish
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btContactSolverInfo *infoGlobal)

{
  btScalar bVar1;
  
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_pNC,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_pC,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_pCF,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_pCRF,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_deltafNC,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_deltafC,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_deltafCF,0);
  btAlignedObjectArray<float>::resizeNoInitialize(&this->m_deltafCRF,0);
  bVar1 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyFinish
                    (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,infoGlobal);
  return bVar1;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlyFinish(btCollisionObject** bodies,int numBodies,const btContactSolverInfo& infoGlobal)
{
	m_pNC.resizeNoInitialize(0);
	m_pC.resizeNoInitialize(0);
	m_pCF.resizeNoInitialize(0);
	m_pCRF.resizeNoInitialize(0);

	m_deltafNC.resizeNoInitialize(0);
	m_deltafC.resizeNoInitialize(0);
	m_deltafCF.resizeNoInitialize(0);
	m_deltafCRF.resizeNoInitialize(0);

	return btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyFinish(bodies, numBodies, infoGlobal);
}